

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O2

lyd_node *
lyd_parse_json(ly_ctx *ctx,char *data,int options,lyd_node *rpc_act,lyd_node *data_tree,
              char *yang_data_name)

{
  LYS_NODE LVar1;
  ly_ctx *ctx_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  lys_node *plVar5;
  lys_node *node;
  lyd_node *plVar6;
  lys_node *plVar7;
  LY_ERR LVar8;
  lyd_node **pplVar9;
  undefined1 root [8];
  char *pcVar10;
  lys_module *plVar11;
  uint uVar12;
  undefined1 local_88 [8];
  attr_cont *attrs;
  lyd_node *next;
  lyd_node *local_70;
  lyd_node *local_68;
  undefined1 local_60 [8];
  lyd_node *act_notif;
  lys_module *local_50;
  ly_ctx *local_48;
  lys_node *local_40;
  lys_node *local_38;
  lyd_node *result;
  
  plVar11 = (lys_module *)(ulong)(uint)options;
  local_38 = (lys_node *)0x0;
  local_60 = (undefined1  [8])0x0;
  local_88 = (undefined1  [8])0x0;
  if (ctx == (ly_ctx *)0x0 || data == (char *)0x0) {
    pcVar10 = "Invalid arguments (%s()).";
    LVar8 = LY_EINVAL;
    ctx = (ly_ctx *)0x0;
LAB_0013d3be:
    ly_log(ctx,LY_LLERR,LVar8,pcVar10,"lyd_parse_json");
    return (lyd_node *)0x0;
  }
  next = rpc_act;
  uVar2 = skip_ws(data);
  if (data[uVar2] != '{') {
    ly_vlog(ctx,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"JSON data (missing top level begin-object)")
    ;
    return (lyd_node *)0x0;
  }
  uVar3 = skip_ws(data + (uVar2 + 1));
  if (data[uVar3 + uVar2 + 1] == '}') {
    if (((uint)options >> 0x11 & 1) != 0) {
      local_38 = (lys_node *)ly_ctx_info(ctx);
    }
    lyd_validate((lyd_node **)&local_38,options,ctx);
    return (lyd_node *)local_38;
  }
  local_68 = (lyd_node *)calloc(1,0x28);
  if (local_68 == (lyd_node *)0x0) {
    pcVar10 = "Memory allocation failed (%s()).";
    LVar8 = LY_EMEM;
    local_68 = (lyd_node *)0x0;
    goto LAB_0013d3be;
  }
  local_70 = (lyd_node *)0x0;
  if (next == (lyd_node *)0x0) {
    plVar5 = (lys_node *)0x0;
    local_40 = (lys_node *)0x0;
    local_50 = plVar11;
    local_48 = ctx;
  }
  else {
    if ((options & 0x20U) == 0) {
      __assert_fail("options & LYD_OPT_RPCREPLY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_json.c"
                    ,0x541,
                    "struct lyd_node *lyd_parse_json(struct ly_ctx *, const char *, int, const struct lyd_node *, const struct lyd_node *, const char *)"
                   );
    }
    if (next->schema->nodetype != LYS_RPC) {
      node = (lys_node *)lyd_dup(next,1);
      plVar7 = node;
      while (plVar5 = plVar7, plVar5 != (lys_node *)0x0) {
        LVar1 = ((lys_node *)plVar5->name)->nodetype;
        if (LVar1 == LYS_ACTION) {
LAB_0013d4dd:
          local_50 = plVar11;
          local_48 = ctx;
          local_40 = node;
          lyd_free_withsiblings((lyd_node *)plVar5->parent);
          goto LAB_0013d4f8;
        }
        if (((LVar1 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
           (plVar7 = plVar5->parent, plVar7 != (lys_node *)0x0)) goto LAB_0013d4c2;
        if (plVar5 == node) goto LAB_0013d4dd;
        do {
          plVar7 = *(lys_node **)&plVar5->flags;
LAB_0013d4c2:
        } while ((plVar7 == (lys_node *)0x0) &&
                (plVar5 = (lys_node *)plVar5->iffeature,
                (lyd_node *)plVar5->iffeature != (lyd_node *)node->iffeature));
      }
      ly_log(ctx,LY_LLERR,LY_EINVAL,
             "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_json");
      goto LAB_0013d71e;
    }
    local_50 = plVar11;
    local_48 = ctx;
    plVar5 = (lys_node *)_lyd_new((lyd_node *)0x0,next->schema,0);
    local_40 = plVar5;
  }
LAB_0013d4f8:
  plVar7 = (lys_node *)0x0;
  plVar6 = (lyd_node *)0x0;
  attrs = (attr_cont *)plVar5;
  act_notif = (lyd_node *)plVar5;
  do {
    uVar3 = skip_ws(data + (uVar2 + 1));
    uVar12 = uVar3 + uVar2 + 1;
    if ((int)local_70 == 0) {
      iVar4 = strncmp(data + uVar12,"\"yang:action\"",0xd);
      if (iVar4 == 0) {
        uVar2 = skip_ws(data + (uVar3 + uVar2 + 0xe));
        uVar3 = uVar12 + uVar2 + 0xd;
        if (data[uVar3] != ':') {
          pcVar10 = "JSON data (missing top-level begin-object)";
          goto LAB_0013d70f;
        }
        uVar2 = skip_ws(data + (uVar12 + uVar2 + 0xe));
        iVar4 = uVar3 + uVar2;
        uVar2 = iVar4 + 1;
        if (data[uVar2] != '{') {
          pcVar10 = "JSON data (missing top level yang:action object)";
          goto LAB_0013d70f;
        }
        uVar3 = skip_ws(data + (iVar4 + 2));
        uVar12 = uVar2 + uVar3 + 1;
        local_70 = (lyd_node *)0x1;
      }
      else {
        local_70 = (lyd_node *)0xffffffffffffffff;
      }
    }
    uVar2 = json_parse_data(local_48,data + uVar12,(lys_node *)&attrs,(lyd_node **)plVar7,plVar6,
                            (lyd_node *)local_88,(attr_cont **)local_50,(int)local_68,
                            (unres_data *)local_60,(lyd_node **)yang_data_name,yang_data_name);
    node = local_40;
    if (uVar2 == 0) goto LAB_0013d71e;
    plVar11 = local_50;
    if (local_38 == (lys_node *)0x0) {
      plVar5 = (lys_node *)attrs;
      if (act_notif == (lyd_node *)0x0) {
        do {
          local_38 = plVar5;
          plVar6 = (lyd_node *)attrs;
          if (local_38 == (lys_node *)0x0) {
            local_38 = (lys_node *)0x0;
            goto LAB_0013d5e2;
          }
          plVar5 = (lys_node *)local_38->ext;
        } while (*(lyd_node **)&((lys_node *)local_38->ext)->flags != (lyd_node *)0x0);
        if ((((uint)local_50 >> 0x11 & 1) != 0) &&
           (plVar11 = (lys_module *)(ulong)((uint)local_50 & 0xfffdffff),
           ((lys_node *)local_38->name)->module !=
           (local_48->models).list[(ulong)local_48->internal_module_count - 1])) {
          plVar11 = (lys_module *)((ulong)local_50 & 0xffffffff);
        }
        goto LAB_0013d5e2;
      }
      local_38 = (lys_node *)attrs[2].next;
      if (local_38 == (lys_node *)0x0) {
        plVar7 = (lys_node *)0x0;
        plVar6 = (lyd_node *)0x0;
      }
      else {
        plVar6 = (lyd_node *)local_38->ext;
        plVar7 = local_38;
      }
    }
    else {
      plVar6 = (lyd_node *)local_38->ext;
LAB_0013d5e2:
      local_50 = plVar11;
      plVar7 = local_38;
      if (act_notif == (lyd_node *)0x0) {
        attrs = (attr_cont *)0x0;
      }
    }
    uVar2 = uVar2 + uVar12;
  } while (data[uVar2] == ',');
  if (data[uVar2] != '}') {
    pcVar10 = "JSON data (missing top-level end-object)";
LAB_0013d70f:
    ly_vlog(local_48,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,pcVar10);
    node = local_40;
    goto LAB_0013d71e;
  }
  uVar3 = skip_ws(data + (uVar2 + 1));
  ctx_00 = local_48;
  if ((int)local_70 == 1) {
    if (data[uVar3 + uVar2 + 1] != '}') {
      pcVar10 = "JSON data (missing top-level end-object)";
      goto LAB_0013d70f;
    }
    skip_ws(data + (uVar3 + uVar2 + 2));
  }
  plVar11 = local_50;
  uVar2 = (uint)local_50;
  iVar4 = store_attrs(ctx_00,(attr_cont *)local_88,(lyd_node *)plVar7,uVar2);
  node = local_40;
  if (iVar4 != 0) goto LAB_0013d71e;
  if (local_40 == (lys_node *)0x0) {
    if (local_38 != (lys_node *)0x0) goto LAB_0013d7c1;
    pcVar10 = "Model for the data to be linked with not found.";
    node = (lys_node *)0x0;
    LVar8 = LY_EVALID;
LAB_0013d875:
    ly_log(ctx_00,LY_LLERR,LVar8,pcVar10);
  }
  else {
    local_38 = local_40;
LAB_0013d7c1:
    if ((((ulong)plVar11 & 0x30) != 0) &&
       (iVar4 = lyd_schema_sort((lyd_node *)local_38,1), iVar4 != 0)) goto LAB_0013d71e;
    plVar5 = local_38;
    if ((((ulong)plVar11 & 0x20) == 0) || (next->schema->nodetype == LYS_RPC)) {
      if ((((ulong)plVar11 & 0x50) != 0) && (local_60 == (undefined1  [8])0x0)) {
        pcVar10 = "action";
        if (((ulong)plVar11 & 0x10) == 0) {
          pcVar10 = "notification";
        }
        ly_vlog(ctx_00,LYE_MISSELEM,LY_VLOG_LYD,local_38,pcVar10,((lys_node *)local_38->name)->name)
        ;
        goto LAB_0013d71e;
      }
    }
    else {
      local_60 = (undefined1  [8])act_notif;
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      plVar6 = ly_ctx_info(ctx_00);
      iVar4 = lyd_merge((lyd_node *)plVar5,plVar6,0x500);
      if (iVar4 != 0) {
        pcVar10 = "Adding ietf-yang-library data failed.";
        LVar8 = LY_EINT;
        goto LAB_0013d875;
      }
    }
    pplVar9 = (lyd_node **)&local_38;
    while (plVar6 = *pplVar9, plVar6 != (lyd_node *)0x0) {
      if ((((plVar6->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
          ((plVar6->validity & 1) != 0)) &&
         (iVar4 = lyv_data_dup(plVar6,(lyd_node *)local_38), iVar4 != 0)) goto LAB_0013d71e;
      pplVar9 = &plVar6->next;
    }
    iVar4 = lyd_defaults_add_unres
                      ((lyd_node **)&local_38,uVar2,ctx_00,(lys_module **)0x0,0,data_tree,
                       (lyd_node *)local_60,(unres_data *)local_68,1);
    if (iVar4 == 0) {
      if (((ulong)plVar11 & 0x2080) == 0) {
        root = local_60;
        if (local_60 == (undefined1  [8])0x0) {
          root = (undefined1  [8])local_38;
        }
        iVar4 = lyd_check_mandatory_tree((lyd_node *)root,ctx_00,(lys_module **)0x0,0,uVar2);
        if (iVar4 != 0) goto LAB_0013d71e;
      }
      plVar6 = local_68;
      free(local_68->schema);
      free(*(UNRES_ITEM **)&plVar6->validity);
      free(plVar6);
      return (lyd_node *)local_38;
    }
  }
LAB_0013d71e:
  lyd_free_withsiblings((lyd_node *)local_38);
  if ((node != (lys_node *)0x0) && (local_38 != node)) {
    lyd_free_withsiblings((lyd_node *)node);
  }
  plVar6 = local_68;
  free(local_68->schema);
  free(*(UNRES_ITEM **)&plVar6->validity);
  free(plVar6);
  return (lyd_node *)0x0;
}

Assistant:

struct lyd_node *
lyd_parse_json(struct ly_ctx *ctx, const char *data, int options, const struct lyd_node *rpc_act,
               const struct lyd_node *data_tree, const char *yang_data_name)
{
    struct lyd_node *result = NULL, *next, *iter, *reply_parent = NULL, *reply_top = NULL, *act_notif = NULL;
    struct unres_data *unres = NULL;
    unsigned int len = 0, r;
    int act_cont = 0;
    struct attr_cont *attrs = NULL;

    if (!ctx || !data) {
        LOGARG;
        return NULL;
    }

    /* skip leading whitespaces */
    len += skip_ws(&data[len]);

    /* expect top-level { */
    if (data[len] != '{') {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top level begin-object)");
        return NULL;
    }

    /* check for empty object */
    r = len + 1;
    r += skip_ws(&data[r]);
    if (data[r] == '}') {
        if (options & LYD_OPT_DATA_ADD_YANGLIB) {
            result = ly_ctx_info(ctx);
        }
        lyd_validate(&result, options, ctx);
        return result;
    }

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(ctx), NULL);

    /* create RPC/action reply part that is not in the parsed data */
    if (rpc_act) {
        assert(options & LYD_OPT_RPCREPLY);
        if (rpc_act->schema->nodetype == LYS_RPC) {
            /* RPC request */
            reply_top = reply_parent = _lyd_new(NULL, rpc_act->schema, 0);
        } else {
            /* action request */
            reply_top = lyd_dup(rpc_act, 1);
            LY_TREE_DFS_BEGIN(reply_top, iter, reply_parent) {
                if (reply_parent->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(reply_top, iter, reply_parent);
            }
            if (!reply_parent) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
                goto error;
            }
            lyd_free_withsiblings(reply_parent->child);
        }
    }

    iter = NULL;
    next = reply_parent;
    do {
        len++;
        len += skip_ws(&data[len]);

        if (!act_cont) {
            if (!strncmp(&data[len], "\"yang:action\"", 13)) {
                len += 13;
                len += skip_ws(&data[len]);
                if (data[len] != ':') {
                    LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level begin-object)");
                    goto error;
                }
                ++len;
                len += skip_ws(&data[len]);
                if (data[len] != '{') {
                    LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top level yang:action object)");
                    goto error;
                }
                ++len;
                len += skip_ws(&data[len]);

                act_cont = 1;
            } else {
                act_cont = -1;
            }
        }

        r = json_parse_data(ctx, &data[len], NULL, &next, result, iter, &attrs, options, unres, &act_notif, yang_data_name);
        if (!r) {
            goto error;
        }
        len += r;

        if (!result) {
            if (reply_parent) {
                result = next->child;
                iter = next->child ? next->child->prev : NULL;
            } else {
                for (iter = next; iter && iter->prev->next; iter = iter->prev);
                result = iter;
                if (iter && (options & LYD_OPT_DATA_ADD_YANGLIB) && iter->schema->module == ctx->models.list[ctx->internal_module_count - 1]) {
                    /* ietf-yang-library data present, so ignore the option to add them */
                    options &= ~LYD_OPT_DATA_ADD_YANGLIB;
                }
                iter = next;
            }
        } else {
            iter = result->prev;
        }
        if (!reply_parent) {
            next = NULL;
        }
    } while (data[len] == ',');

    if (data[len] != '}') {
        /* expecting end-object */
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level end-object)");
        goto error;
    }
    len++;
    len += skip_ws(&data[len]);

    if (act_cont == 1) {
        if (data[len] != '}') {
            LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "JSON data (missing top-level end-object)");
            goto error;
        }
        len++;
        len += skip_ws(&data[len]);
    }

    /* store attributes */
    if (store_attrs(ctx, attrs, result, options)) {
        goto error;
    }

    if (reply_top) {
        result = reply_top;
    }

    if (!result) {
        LOGERR(ctx, LY_EVALID, "Model for the data to be linked with not found.");
        goto error;
    }

    /* order the elements by hand as it is not required of the JSON input */
    if ((options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY))) {
        if (lyd_schema_sort(result, 1)) {
            goto error;
        }
    }

    if ((options & LYD_OPT_RPCREPLY) && (rpc_act->schema->nodetype != LYS_RPC)) {
        /* action reply */
        act_notif = reply_parent;
    } else if ((options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) && !act_notif) {
        LOGVAL(ctx, LYE_MISSELEM, LY_VLOG_LYD, result, (options & LYD_OPT_RPC ? "action" : "notification"), result->schema->name);
        goto error;
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (lyd_merge(result, ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto error;
        }
    }

    /* check for uniquness of top-level lists/leaflists because
     * only the inner instances were tested in lyv_data_content() */
    LY_TREE_FOR(result, iter) {
        if (!(iter->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(iter->validity & LYD_VAL_DUP)) {
            continue;
        }

        if (lyv_data_dup(iter, result)) {
            goto error;
        }
    }

    /* add/validate default values, unres */
    if (lyd_defaults_add_unres(&result, options, ctx, NULL, 0, data_tree, act_notif, unres, 1)) {
        goto error;
    }

    /* check for missing top level mandatory nodes */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))
            && lyd_check_mandatory_tree((act_notif ? act_notif : result), ctx, NULL, 0, options)) {
        goto error;
    }

    free(unres->node);
    free(unres->type);
    free(unres);

    return result;

error:
    lyd_free_withsiblings(result);
    if (reply_top && result != reply_top) {
        lyd_free_withsiblings(reply_top);
    }
    free(unres->node);
    free(unres->type);
    free(unres);

    return NULL;
}